

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VirtualMemory_unix.cpp
# Opt level: O0

bool __thiscall xmrig::VirtualMemory::allocateLargePagesMemory(VirtualMemory *this)

{
  int iVar1;
  void *pvVar2;
  size_t *in_RDI;
  bitset<3UL> *unaff_retaddr;
  size_t *psVar3;
  undefined1 __val;
  undefined7 in_stack_fffffffffffffff8;
  undefined1 in_stack_ffffffffffffffff;
  bool bVar4;
  
  psVar3 = in_RDI;
  pvVar2 = allocateLargePagesMemory((size_t)in_RDI);
  __val = (undefined1)((ulong)psVar3 >> 0x38);
  in_RDI[3] = (size_t)pvVar2;
  if (in_RDI[3] == 0) {
    bVar4 = false;
  }
  else {
    std::bitset<3UL>::set
              (unaff_retaddr,CONCAT17(in_stack_ffffffffffffffff,in_stack_fffffffffffffff8),
               (bool)__val);
    madvise((void *)in_RDI[3],*in_RDI,3);
    iVar1 = mlock((void *)in_RDI[3],*in_RDI);
    if (iVar1 == 0) {
      std::bitset<3UL>::set
                (unaff_retaddr,CONCAT17(in_stack_ffffffffffffffff,in_stack_fffffffffffffff8),
                 (bool)__val);
    }
    bVar4 = true;
  }
  return bVar4;
}

Assistant:

bool xmrig::VirtualMemory::allocateLargePagesMemory()
{
    m_scratchpad = static_cast<uint8_t*>(allocateLargePagesMemory(m_size));
    if (m_scratchpad) {
        m_flags.set(FLAG_HUGEPAGES, true);

        madvise(m_scratchpad, m_size, MADV_RANDOM | MADV_WILLNEED);

        if (mlock(m_scratchpad, m_size) == 0) {
            m_flags.set(FLAG_LOCK, true);
        }

        return true;
    }

    return false;
}